

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

string * __thiscall CFG::toDOT_abi_cxx11_(string *__return_storage_ptr__,CFG *this)

{
  Type TVar1;
  CfgNode *node;
  Data *pDVar2;
  long lVar3;
  CfgNode *node_00;
  ostream *poVar4;
  _List_node_base *__return_storage_ptr___00;
  _Base_ptr p_Var5;
  char *pcVar6;
  _List_node_base *this_00;
  _Self __tmp;
  int local_254;
  set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_> succs;
  list<Instruction_*,_std::allocator<Instruction_*>_> instrs;
  list<CfgNode_*,_std::allocator<CfgNode_*>_> nodes;
  string local_1d8;
  stringstream ss;
  long local_1a8 [3];
  uint auStack_190 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
  poVar4 = std::operator<<((ostream *)local_1a8,"digraph \"0x");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"\" {");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)local_1a8,"  label = \"0x");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," (");
  poVar4 = std::operator<<(poVar4,(string *)&this->m_functionName);
  poVar4 = std::operator<<(poVar4,")\"");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)local_1a8,"  labelloc = \"t\"");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)local_1a8,"  node[shape=record]");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
  __return_storage_ptr___00 = (_List_node_base *)&nodes;
  nodes_abi_cxx11_((list<CfgNode_*,_std::allocator<CfgNode_*>_> *)__return_storage_ptr___00,this);
  local_254 = 1;
  do {
    __return_storage_ptr___00 =
         (((_List_base<CfgNode_*,_std::allocator<CfgNode_*>_> *)&__return_storage_ptr___00->_M_next)
         ->_M_impl)._M_node.super__List_node_base._M_next;
    if (__return_storage_ptr___00 == (_List_node_base *)&nodes) {
      poVar4 = std::operator<<((ostream *)local_1a8,"}");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::_List_base<CfgNode_*,_std::allocator<CfgNode_*>_>::_M_clear
                (&nodes.super__List_base<CfgNode_*,_std::allocator<CfgNode_*>_>);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return __return_storage_ptr__;
    }
    node = (CfgNode *)__return_storage_ptr___00[1]._M_next;
    pcVar6 = "  Entry [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled]";
    switch(node->m_type) {
    case CFG_ENTRY:
      break;
    case CFG_BLOCK:
      pDVar2 = node->m_data;
      if (pDVar2 == (Data *)0x0) {
        __assert_fail("node->data() != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                      ,0x11c,"std::string CFG::toDOT() const");
      }
      poVar4 = std::operator<<((ostream *)local_1a8,"  \"0x");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,"\" [label=\"{");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)local_1a8,"    0x");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," [");
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,*(int *)&pDVar2[1]._vptr_Data);
      poVar4 = std::operator<<(poVar4,"]\\l");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)local_1a8,"    | [instrs]\\l");
      std::endl<char,std::char_traits<char>>(poVar4);
      this_00 = (_List_node_base *)&instrs;
      std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::list
                ((list<Instruction_*,_std::allocator<Instruction_*>_> *)this_00,
                 (list<Instruction_*,_std::allocator<Instruction_*>_> *)&pDVar2[1].m_addr);
      while (this_00 = (((_List_base<Instruction_*,_std::allocator<Instruction_*>_> *)
                        &this_00->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            this_00 != (_List_node_base *)&instrs) {
        lVar3 = (long)this_00[1]._M_next;
        poVar4 = std::operator<<((ostream *)local_1a8,"    &nbsp;&nbsp;0x");
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," \\<+");
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,*(int *)(lVar3 + 0x10));
        poVar4 = std::operator<<(poVar4,"\\>: ");
        dotFilter((string *)&succs,(string *)(lVar3 + 0x18));
        poVar4 = std::operator<<(poVar4,(string *)&succs);
        poVar4 = std::operator<<(poVar4,"\\l");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&succs);
      }
      std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>::
      _Rb_tree((_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>
                *)&succs,
               (_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>
                *)(pDVar2 + 3));
      if (succs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        poVar4 = std::operator<<((ostream *)local_1a8,"     | [calls]\\l");
        std::endl<char,std::char_traits<char>>(poVar4);
        *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
        for (p_Var5 = succs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != &succs._M_t._M_impl.super__Rb_tree_header;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          lVar3 = *(long *)(p_Var5 + 1);
          poVar4 = std::operator<<((ostream *)local_1a8,"     &nbsp;&nbsp;0x");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          poVar4 = std::operator<<(poVar4," (");
          dotFilter(&local_1d8,(string *)(lVar3 + 0x18));
          poVar4 = std::operator<<(poVar4,(string *)&local_1d8);
          poVar4 = std::operator<<(poVar4,")\\l");
          std::endl<char,std::char_traits<char>>(poVar4);
          std::__cxx11::string::~string((string *)&local_1d8);
        }
      }
      poVar4 = std::operator<<((ostream *)local_1a8,"  }\"]");
      std::endl<char,std::char_traits<char>>(poVar4);
      if (*(char *)((long)&pDVar2[1]._vptr_Data + 4) == '\x01') {
        poVar4 = std::operator<<((ostream *)local_1a8,"  \"Unknown");
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_254);
        poVar4 = std::operator<<(poVar4,"\" [label=\"?\", shape=none]");
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)local_1a8,"  \"0x");
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,"\" -> \"Unknown");
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_254);
        poVar4 = std::operator<<(poVar4,"\" [style=dashed]");
        std::endl<char,std::char_traits<char>>(poVar4);
        local_254 = local_254 + 1;
      }
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
      std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>::
      ~_Rb_tree((_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>
                 *)&succs);
      std::__cxx11::_List_base<Instruction_*,_std::allocator<Instruction_*>_>::_M_clear
                (&instrs.super__List_base<Instruction_*,_std::allocator<Instruction_*>_>);
      goto LAB_001053e4;
    case CFG_PHANTOM:
      if (node->m_data == (Data *)0x0) {
        __assert_fail("node->data() != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                      ,0x145,"std::string CFG::toDOT() const");
      }
      poVar4 = std::operator<<((ostream *)local_1a8,"  \"0x");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,"\" [label=\"{");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)local_1a8,"     0x");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,"\\l");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)local_1a8,"  }\", style=dashed]");
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_001053e4;
    case CFG_EXIT:
      pcVar6 = 
      "  Exit [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled,peripheries=2]"
      ;
      break;
    case CFG_HALT:
      pcVar6 = 
      "  Halt [label=\"\",width=0.3,height=0.3,shape=square,fillcolor=black,style=filled,peripheries=2]"
      ;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                    ,0x14f,"std::string CFG::toDOT() const");
    }
    poVar4 = std::operator<<((ostream *)local_1a8,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
LAB_001053e4:
    std::
    _Rb_tree<CfgNode::Edge,_CfgNode::Edge,_std::_Identity<CfgNode::Edge>,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>
    ::_Rb_tree(&succs._M_t,&(node->m_succs)._M_t);
    for (p_Var5 = succs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &succs._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      if (node->m_type - CFG_BLOCK < 2) {
        poVar4 = std::operator<<((ostream *)local_1a8,"  \"0x");
        CfgNode::node2addr(node);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        pcVar6 = "\" -> ";
      }
      else {
        pcVar6 = "  Entry -> ";
        poVar4 = (ostream *)local_1a8;
        if (node->m_type != CFG_ENTRY) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                        ,0x15e,"std::string CFG::toDOT() const");
        }
      }
      std::operator<<(poVar4,pcVar6);
      node_00 = (CfgNode *)p_Var5[1]._M_parent;
      TVar1 = node_00->m_type;
      if (TVar1 - CFG_BLOCK < 2) {
        poVar4 = std::operator<<((ostream *)local_1a8,"\"0x");
        CfgNode::node2addr(node_00);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        pcVar6 = "\"";
      }
      else {
        pcVar6 = "Exit";
        poVar4 = (ostream *)local_1a8;
        if (TVar1 != CFG_EXIT) {
          if (TVar1 != CFG_HALT) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                          ,0x16f,"std::string CFG::toDOT() const");
          }
          pcVar6 = "Halt";
        }
      }
      std::operator<<(poVar4,pcVar6);
      std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
    }
    std::
    _Rb_tree<CfgNode::Edge,_CfgNode::Edge,_std::_Identity<CfgNode::Edge>,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>
    ::~_Rb_tree(&succs._M_t);
  } while( true );
}

Assistant:

std::string CFG::toDOT() const {
	std::stringstream ss;
	int unknown = 1;

	ss << std::hex;
	ss << "digraph \"0x" << m_addr << "\" {" << std::endl;
	ss << "  label = \"0x" << m_addr << " (" << m_functionName << ")\"" << std::endl;
    ss << "  labelloc = \"t\"" << std::endl;
    ss << "  node[shape=record]" << std::endl;
    ss << std::endl;

	std::list<CfgNode*> nodes = this->nodes();
	for (std::list<CfgNode*>::const_iterator it = nodes.cbegin(),
			ed = nodes.cend(); it != ed; it++) {
		CfgNode* node = *it;
		switch (node->type()) {
			case CfgNode::CFG_ENTRY:
			    ss << "  Entry [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled]" << std::endl;
			    break;
			case CfgNode::CFG_EXIT:
				ss << "  Exit [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled,peripheries=2]" << std::endl;
			    break;
			case CfgNode::CFG_HALT:
				ss << "  Halt [label=\"\",width=0.3,height=0.3,shape=square,fillcolor=black,style=filled,peripheries=2]" << std::endl;
			    break;
			case CfgNode::CFG_BLOCK: {
				assert(node->data() != 0);
				CfgNode::BlockData* blockData = static_cast<CfgNode::BlockData*>(node->data());

				Addr addr =  blockData->addr();
				ss << "  \"0x" << addr << "\" [label=\"{" << std::endl;
				ss << "    0x" << addr << " [" << std::dec << blockData->size() << "]\\l" << std::endl;
				ss << "    | [instrs]\\l" << std::endl;

				std::list<Instruction*> instrs = blockData->instructions();
				for (std::list<Instruction*>::const_iterator it = instrs.cbegin(), ed = instrs.cend();
						it != ed; it++) {
					Instruction* instr = *it;
					ss << "    &nbsp;&nbsp;0x" << std::hex << instr->addr() << " \\<+"
							<< std::dec << instr->size() << "\\>: " << dotFilter(instr->text())
							<< "\\l" << std::endl;
				}

				std::set<CFG*> calls = blockData->calls();
				if (!calls.empty()) {
					ss << "     | [calls]\\l" << std::endl;
					ss << std::hex;
					for (std::set<CFG*>::const_iterator it = calls.cbegin(), ed = calls.cend();
							it != ed; it++) {
						CFG* called = *it;
						ss << "     &nbsp;&nbsp;0x" << called->addr() << " ("
							<< dotFilter(called->functionName()) << ")\\l" << std::endl;
					}
				}

				ss << "  }\"]" << std::endl;

                if (blockData->isIndirect()) {
                		ss << "  \"Unknown" << std::dec << unknown << "\" [label=\"?\", shape=none]" << std::endl;
                		ss << "  \"0x" << std::hex << blockData->addr() << "\" -> \"Unknown" << std::dec << unknown << "\" [style=dashed]" << std::endl;
                    unknown++;
                }

				ss << std::hex;
				break;
			}
			case CfgNode::CFG_PHANTOM: {
				assert(node->data() != 0);
				CfgNode::PhantomData* phantomData = static_cast<CfgNode::PhantomData*>(node->data());

				ss << "  \"0x" << phantomData->addr() << "\" [label=\"{" << std::endl;
				ss << "     0x" << phantomData->addr() << "\\l" << std::endl;
				ss << "  }\", style=dashed]" << std::endl;

				break;
			}
			default:
				assert(false);
		}

		std::set<CfgNode::Edge> succs = node->successors();
		for (std::set<CfgNode::Edge>::iterator it = succs.begin(), ed = succs.end();
				it != ed; it++) {
			switch (node->type()) {
				case CfgNode::CFG_ENTRY:
					ss << "  Entry -> ";
					break;
				case CfgNode::CFG_BLOCK:
				case CfgNode::CFG_PHANTOM:
					ss << "  \"0x" << CfgNode::node2addr(node) << "\" -> ";
					break;
				default:
					assert(false);
			}

			CfgNode* succ = it->node;
			switch (succ->type()) {
				case CfgNode::CFG_EXIT:
					ss << "Exit";
					break;
				case CfgNode::CFG_HALT:
					ss << "Halt";
					break;
				case CfgNode::CFG_BLOCK:
				case CfgNode::CFG_PHANTOM:
					ss << "\"0x" << CfgNode::node2addr(succ) << "\"";
					break;
				case CfgNode::CFG_ENTRY:
				default:
					assert(false);
			}

			ss << std::endl;
		}
	}
	ss << "}" << std::endl;

	return ss.str();
}